

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int pager_unlink_page(Pager *pPager,Page *pPage)

{
  Page *pPVar1;
  Page *pPVar2;
  Page **ppPVar3;
  
  pPVar1 = pPage->pNextCollide;
  pPVar2 = pPage->pPrevCollide;
  if (pPVar1 != (Page *)0x0) {
    pPVar1->pPrevCollide = pPVar2;
  }
  if (pPVar2 == (Page *)0x0) {
    ppPVar3 = pPager->apHash + (pPager->nSize - 1 & (uint)pPage->pgno);
  }
  else {
    ppPVar3 = &pPVar2->pNextCollide;
  }
  *ppPVar3 = pPVar1;
  if (pPager->pAll == pPage) {
    pPager->pAll = pPager->pAll->pNext;
  }
  pPVar1 = pPage->pNext;
  pPVar2 = pPage->pPrev;
  if (pPVar2 != (Page *)0x0) {
    pPVar2->pNext = pPVar1;
  }
  if (pPVar1 != (Page *)0x0) {
    pPVar1->pPrev = pPVar2;
  }
  pPager->nPage = pPager->nPage - 1;
  return (int)pPVar1;
}

Assistant:

static int pager_unlink_page(Pager *pPager,Page *pPage)
{
	if( pPage->pNextCollide ){
		pPage->pNextCollide->pPrevCollide = pPage->pPrevCollide;
	}
	if( pPage->pPrevCollide ){
		pPage->pPrevCollide->pNextCollide = pPage->pNextCollide;
	}else{
		sxu32 nBucket = PAGE_HASH(pPage->pgno) & (pPager->nSize - 1);
		pPager->apHash[nBucket] = pPage->pNextCollide;
	}
	MACRO_LD_REMOVE(pPager->pAll,pPage);
	pPager->nPage--;
	return UNQLITE_OK;
}